

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-netpack.c
# Opt level: O2

int lfilter(lua_State *L)

{
  ushort uVar1;
  int *piVar2;
  lua_Integer lVar3;
  queue *q;
  uncomplete *puVar4;
  void *pvVar5;
  uint uVar6;
  ushort *msg;
  uint uVar7;
  int iVar8;
  int size;
  int iVar9;
  ushort *puVar10;
  int iVar11;
  ulong uVar12;
  byte *buffer;
  
  piVar2 = (int *)lua_touserdata(L,2);
  lVar3 = luaL_checkinteger(L,3);
  puVar10 = *(ushort **)(piVar2 + 4);
  msg = (ushort *)(piVar2 + 6);
  if (puVar10 != (ushort *)0x0) {
    msg = puVar10;
  }
  lua_settop(L,1);
  if (6 < *piVar2 - 1U) {
    return 1;
  }
  uVar7 = -(uint)(puVar10 != (ushort *)0x0) | (int)lVar3 - 0x18U;
  iVar9 = 1;
  switch(*piVar2) {
  case 1:
    if (uVar7 != 0xffffffff) {
      __assert_fail("size == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/lualib-src/lua-netpack.c"
                    ,0x160,"int lfilter(lua_State *)");
    }
    uVar7 = piVar2[1];
    iVar8 = piVar2[2];
    iVar9 = 1;
    q = (queue *)lua_touserdata(L,1);
    puVar4 = find_uncomplete(q,uVar7);
    if (puVar4 == (uncomplete *)0x0) {
      if (iVar8 == 1) {
        puVar4 = save_uncomplete(L,uVar7);
        puVar4->read = -1;
        puVar4->header = (uint)(byte)*msg;
      }
      else {
        uVar1 = *msg << 8 | *msg >> 8;
        puVar10 = msg + 1;
        iVar11 = (int)((long)iVar8 - 2U);
        size = iVar11 - (uint)uVar1;
        uVar6 = (uint)uVar1;
        if ((int)(uint)uVar1 <= iVar11) {
          if (size != 0) {
            push_data(L,uVar7,puVar10,uVar6,1);
            buffer = (byte *)((ulong)uVar6 + (long)puVar10);
            goto LAB_0011cdf9;
          }
          lua_pushvalue(L,-0xf4629);
          lua_pushinteger(L,(long)(int)uVar7);
          uVar12 = (ulong)(uint)uVar1;
          pvVar5 = malloc(uVar12);
          memcpy(pvVar5,puVar10,uVar12);
          lua_pushlightuserdata(L,pvVar5);
          lua_pushinteger(L,uVar12);
          goto LAB_0011cdd0;
        }
        puVar4 = save_uncomplete(L,uVar7);
        puVar4->read = iVar11;
        (puVar4->pack).size = (uint)uVar1;
        pvVar5 = malloc((ulong)uVar6);
        (puVar4->pack).buffer = pvVar5;
        memcpy(pvVar5,puVar10,(long)iVar8 - 2U);
      }
    }
    else {
      uVar6 = puVar4->read;
      if ((int)uVar6 < 0) {
        if (uVar6 != 0xffffffff) {
          __assert_fail("uc->read == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/lualib-src/lua-netpack.c"
                        ,0xe9,"int filter_data_(lua_State *, int, uint8_t *, int)");
        }
        uVar12 = (long)(puVar4->header << 8) | (ulong)(byte)*msg;
        puVar10 = (ushort *)((long)msg + 1);
        iVar8 = iVar8 + -1;
        (puVar4->pack).size = (int)uVar12;
        pvVar5 = malloc(uVar12);
        (puVar4->pack).buffer = pvVar5;
        puVar4->read = 0;
        uVar6 = 0;
      }
      else {
        uVar12 = (ulong)(uint)(puVar4->pack).size;
        pvVar5 = (puVar4->pack).buffer;
        puVar10 = msg;
      }
      iVar11 = (int)uVar12 - uVar6;
      if (iVar8 < iVar11) {
        memcpy((void *)((ulong)uVar6 + (long)pvVar5),puVar10,(long)iVar8);
        puVar4->read = puVar4->read + iVar8;
        uVar7 = ((int)uVar7 >> 0x18) + (uVar7 >> 0xc) + uVar7 & 0xfff;
        puVar4->next = q->hash[uVar7];
        q->hash[uVar7] = puVar4;
      }
      else {
        memcpy((void *)((ulong)uVar6 + (long)pvVar5),puVar10,(long)iVar11);
        size = iVar8 - iVar11;
        if (size == 0) {
          lua_pushvalue(L,-0xf4629);
          lua_pushinteger(L,(long)(int)uVar7);
          lua_pushlightuserdata(L,(puVar4->pack).buffer);
          lua_pushinteger(L,(long)(puVar4->pack).size);
          free(puVar4);
LAB_0011cdd0:
          iVar9 = 5;
        }
        else {
          buffer = (byte *)((long)puVar10 + (long)iVar11);
          push_data(L,uVar7,(puVar4->pack).buffer,(puVar4->pack).size,0);
          free(puVar4);
LAB_0011cdf9:
          push_more(L,uVar7,buffer,size);
          lua_pushvalue(L,-0xf462a);
          iVar9 = 2;
        }
      }
    }
    free(msg);
    break;
  case 3:
    close_uncomplete(L,piVar2[1]);
    lua_pushvalue(L,-0xf462d);
    lua_pushinteger(L,(long)piVar2[1]);
    iVar9 = 3;
    break;
  case 4:
    lua_pushvalue(L,-0xf462c);
    iVar9 = piVar2[2];
    goto LAB_0011cba0;
  case 5:
    close_uncomplete(L,piVar2[1]);
    lua_pushvalue(L,-0xf462b);
    iVar9 = piVar2[1];
LAB_0011cba0:
    lua_pushinteger(L,(long)iVar9);
    pushstring(L,(char *)msg,uVar7);
LAB_0011cbe0:
    iVar9 = 4;
    break;
  case 7:
    lua_pushvalue(L,-0xf462e);
    lua_pushinteger(L,(long)piVar2[1]);
    lua_pushinteger(L,(long)piVar2[2]);
    goto LAB_0011cbe0;
  }
  return iVar9;
}

Assistant:

static int
lfilter(lua_State *L) {
	struct skynet_socket_message *message = lua_touserdata(L,2);
	int size = luaL_checkinteger(L,3);
	char * buffer = message->buffer;
	if (buffer == NULL) {
		buffer = (char *)(message+1);
		size -= sizeof(*message);
	} else {
		size = -1;
	}

	lua_settop(L, 1);

	switch(message->type) {
	case SKYNET_SOCKET_TYPE_DATA:
		// ignore listen id (message->id)
		assert(size == -1);	// never padding string
		return filter_data(L, message->id, (uint8_t *)buffer, message->ud);
	case SKYNET_SOCKET_TYPE_CONNECT:
		// ignore listen fd connect
		return 1;
	case SKYNET_SOCKET_TYPE_CLOSE:
		// no more data in fd (message->id)
		close_uncomplete(L, message->id);
		lua_pushvalue(L, lua_upvalueindex(TYPE_CLOSE));
		lua_pushinteger(L, message->id);
		return 3;
	case SKYNET_SOCKET_TYPE_ACCEPT:
		lua_pushvalue(L, lua_upvalueindex(TYPE_OPEN));
		// ignore listen id (message->id);
		lua_pushinteger(L, message->ud);
		pushstring(L, buffer, size);
		return 4;
	case SKYNET_SOCKET_TYPE_ERROR:
		// no more data in fd (message->id)
		close_uncomplete(L, message->id);
		lua_pushvalue(L, lua_upvalueindex(TYPE_ERROR));
		lua_pushinteger(L, message->id);
		pushstring(L, buffer, size);
		return 4;
	case SKYNET_SOCKET_TYPE_WARNING:
		lua_pushvalue(L, lua_upvalueindex(TYPE_WARNING));
		lua_pushinteger(L, message->id);
		lua_pushinteger(L, message->ud);
		return 4;
	default:
		// never get here
		return 1;
	}
}